

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O0

bool_t ArrayAlloc(array *p,size_t Total,size_t Align)

{
  size_t sVar1;
  size_t n;
  bool_t bVar2;
  size_t Size;
  size_t Align_local;
  size_t Total_local;
  array *p_local;
  
  sVar1 = ArraySize(p);
  n = SizeAlign(Total,Align);
  bVar2 = Data_ReAlloc(p,n);
  if (bVar2 != 0) {
    p->_Used = sVar1;
  }
  p_local = (array *)(ulong)(bVar2 != 0);
  return (bool_t)p_local;
}

Assistant:

bool_t ArrayAlloc(array* p,size_t Total,size_t Align)
{
    size_t Size = ArraySize(p);
    if (!Data_ReAlloc(p,SizeAlign(Total,Align)))
        return 0;
    p->_Used = Size;
    return 1;
}